

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mediator.cpp
# Opt level: O2

int main(void)

{
  Person *pPVar1;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int in_R8D;
  PersonReference j;
  ChatRoom room;
  PersonReference m;
  PersonReference p;
  allocator<char> local_fa;
  allocator<char> local_f9;
  string local_f8;
  undefined1 local_d8 [16];
  string local_c8;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  string local_88;
  string local_68 [32];
  string local_48 [32];
  string local_28 [32];
  
  local_c8._M_dataplus._M_p = (pointer)0x0;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_allocated_capacity = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_28,"Peter",(allocator<char> *)&local_f8);
  ChatRoom::join((ChatRoom *)local_98,(string *)(local_d8 + 0x10));
  std::__cxx11::string::~string(local_28);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"Mark",(allocator<char> *)&local_f8);
  ChatRoom::join((ChatRoom *)local_a8,(string *)(local_d8 + 0x10));
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::string<std::allocator<char>>(local_68,"John",(allocator<char> *)&local_f8);
  ChatRoom::join((ChatRoom *)local_d8,(string *)(local_d8 + 0x10));
  std::__cxx11::string::~string(local_68);
  pPVar1 = ChatRoom::PersonReference::operator->((PersonReference *)local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"Hi everyone!",(allocator<char> *)(local_98 + 0x10));
  Person::send(pPVar1,(int)&local_f8,__buf,in_RCX,in_R8D);
  std::__cxx11::string::~string((string *)&local_f8);
  pPVar1 = ChatRoom::PersonReference::operator->((PersonReference *)local_a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"Hi everyone!",(allocator<char> *)(local_98 + 0x10));
  Person::send(pPVar1,(int)&local_f8,__buf_00,in_RCX,in_R8D);
  std::__cxx11::string::~string((string *)&local_f8);
  pPVar1 = ChatRoom::PersonReference::operator->((PersonReference *)local_d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"Hi everyone!",(allocator<char> *)(local_98 + 0x10));
  Person::send(pPVar1,(int)&local_f8,__buf_01,in_RCX,in_R8D);
  std::__cxx11::string::~string((string *)&local_f8);
  pPVar1 = ChatRoom::PersonReference::operator->((PersonReference *)local_d8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"Peter",&local_f9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_98 + 0x10),"Yo Pete!",&local_fa);
  Person::private_message(pPVar1,&local_f8,(string *)(local_98 + 0x10));
  std::__cxx11::string::~string((string *)(local_98 + 0x10));
  std::__cxx11::string::~string((string *)&local_f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
  std::vector<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_>::~vector
            ((vector<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_> *)
             (local_d8 + 0x10));
  return 0;
}

Assistant:

int main()
{
	ChatRoom room;
	auto p{room.join("Peter")};
	auto m{room.join("Mark")};
	auto j{room.join("John")};
	p->send("Hi everyone!");
	m->send("Hi everyone!");
	j->send("Hi everyone!");
	j->private_message("Peter", "Yo Pete!");

	return 0;
}